

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridDataType2::GridDataType2(GridDataType2 *this,KDataStream *stream)

{
  KDataStream *stream_local;
  GridDataType2 *this_local;
  
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType2_00334de0;
  std::vector<float,_std::allocator<float>_>::vector(&this->m_vf32Values);
  (*(this->super_GridData).super_DataTypeBase._vptr_DataTypeBase[3])(this,stream);
  return;
}

Assistant:

GridDataType2::GridDataType2(KDataStream &stream) noexcept(false)
{
    Decode( stream );
}